

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log.cpp
# Opt level: O0

void __thiscall booster::log::sinks::syslog::~syslog(syslog *this,int __pri,char *__fmt,...)

{
  data *pdVar1;
  data *in_stack_ffffffffffffffe0;
  
  (this->super_sink)._vptr_sink = (_func_int **)&PTR_log_002e8cd8;
  pdVar1 = hold_ptr<booster::log::sinks::syslog::data>::get(&this->d);
  if (pdVar1 != (data *)0x0) {
    in_stack_ffffffffffffffe0 = hold_ptr<booster::log::sinks::syslog::data>::operator->(&this->d);
    if ((in_stack_ffffffffffffffe0->log_was_opened & 1U) != 0) {
      closelog();
    }
  }
  hold_ptr<booster::log::sinks::syslog::data>::~hold_ptr
            ((hold_ptr<booster::log::sinks::syslog::data> *)in_stack_ffffffffffffffe0);
  sink::~sink((sink *)0x222fcd);
  return;
}

Assistant:

syslog::~syslog()
		{
			if(d.get() && d->log_was_opened)
				closelog();
		}